

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

bool __thiscall CScript::IsPayToAnchor(CScript *this)

{
  long lVar1;
  size_type sVar2;
  uchar *puVar3;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  uint7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  bVar4 = false;
  if (sVar2 == 4) {
    sVar2 = (size_type)((ulong)in_RDI >> 0x20);
    puVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        (ulong)in_stack_ffffffffffffffe8,sVar2);
    bVar4 = false;
    if (*puVar3 == 'Q') {
      puVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          (ulong)in_stack_ffffffffffffffe8,sVar2);
      bVar4 = false;
      if (*puVar3 == '\x02') {
        puVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                           ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                            (ulong)in_stack_ffffffffffffffe8,sVar2);
        bVar4 = false;
        if (*puVar3 == 'N') {
          puVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                             ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                              (ulong)in_stack_ffffffffffffffe8,sVar2);
          bVar4 = *puVar3 == 's';
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CScript::IsPayToAnchor() const
{
    return (this->size() == 4 &&
        (*this)[0] == OP_1 &&
        (*this)[1] == 0x02 &&
        (*this)[2] == 0x4e &&
        (*this)[3] == 0x73);
}